

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<35UL> * __thiscall
mserialize::cx_strcat<1ul,33ul,1ul>
          (cx_string<35UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<33UL> *strings_1,cx_string<1UL> *strings_2)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_78 [5];
  mserialize *local_50;
  cx_string<1UL> *local_48;
  cx_string<33UL> *local_40;
  char buffer [36];
  
  pcVar1 = buffer;
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_50 = this;
  local_48 = strings;
  local_40 = strings_1;
  auStack_78[1] = 1;
  auStack_78[2] = 0x21;
  auStack_78[3] = 1;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_78[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)(auStack_78[lVar2 + 4] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<35UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}